

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

ActionMessage * __thiscall
helics::NetworkCommsInterface::generatePortRequest
          (ActionMessage *__return_storage_ptr__,NetworkCommsInterface *this,int cnt)

{
  string_view string1;
  string_view string2;
  string sStack_38;
  
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
  __return_storage_ptr__->messageID = 0x5af;
  gmlc::networking::stripProtocol(&sStack_38,&(this->super_CommsInterface).localTargetAddress);
  SmallBuffer::operator=(&__return_storage_ptr__->payload,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  __return_storage_ptr__->counter = (uint16_t)cnt;
  string1._M_str = (this->super_CommsInterface).brokerName._M_dataplus._M_p;
  string1._M_len = (this->super_CommsInterface).brokerName._M_string_length;
  string2._M_str = (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
  string2._M_len = (this->super_CommsInterface).brokerInitString._M_string_length;
  ActionMessage::setStringData(__return_storage_ptr__,string1,string2);
  return __return_storage_ptr__;
}

Assistant:

ActionMessage NetworkCommsInterface::generatePortRequest(int cnt) const
{
    ActionMessage req(CMD_PROTOCOL);
    req.messageID = REQUEST_PORTS;
    req.payload = gmlc::networking::stripProtocol(localTargetAddress);
    req.counter = cnt;
    req.setStringData(brokerName, brokerInitString);
    return req;
}